

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O0

IterateResult __thiscall dit::EndiannessConsistencyCase::iterate(EndiannessConsistencyCase *this)

{
  TestLog *this_00;
  MessageBuilder *this_01;
  char *description;
  MessageBuilder local_198;
  byte local_13;
  undefined2 local_12;
  bool isOk;
  EndiannessConsistencyCase *pEStack_10;
  deUint16 multiByte;
  EndiannessConsistencyCase *this_local;
  
  local_12 = 0x102;
  local_13 = 1;
  pEStack_10 = this;
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_198,(char (*) [48])"Verifying DE_ENDIANNESS matches actual behavior");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  description = "Configured endianness inconsistent";
  if ((local_13 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)((local_13 & 1) == 0),description
            );
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint16	multiByte	= (deUint16)0x0102;

#if DE_ENDIANNESS == DE_BIG_ENDIAN
		const bool		isOk		= *((const deUint8*)&multiByte) == (deUint8)0x01;
#elif DE_ENDIANNESS == DE_LITTLE_ENDIAN
		const bool		isOk		= *((const deUint8*)&multiByte) == (deUint8)0x02;
#endif

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Verifying DE_ENDIANNESS matches actual behavior"
			<< TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Configured endianness inconsistent");
		return STOP;
	}